

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LCollectColorRedTransforms_C
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_red,int *histo
               )

{
  byte bVar1;
  int in_ECX;
  int iVar2;
  int in_EDX;
  long in_R9;
  int x;
  long lVar3;
  undefined4 local_24;
  undefined4 local_14;
  
  local_14 = in_ECX;
  while (iVar2 = local_14 + -1, 0 < local_14) {
    for (local_24 = 0; local_14 = iVar2, local_24 < in_EDX; local_24 = local_24 + 1) {
      lVar3 = in_R9;
      bVar1 = TransformColorRed((uint8_t)((ulong)in_R9 >> 0x38),(uint32_t)in_R9);
      *(int *)(lVar3 + (ulong)bVar1 * 4) = *(int *)(lVar3 + (ulong)bVar1 * 4) + 1;
    }
  }
  return;
}

Assistant:

void VP8LCollectColorRedTransforms_C(const uint32_t* argb, int stride,
                                     int tile_width, int tile_height,
                                     int green_to_red, int histo[]) {
  while (tile_height-- > 0) {
    int x;
    for (x = 0; x < tile_width; ++x) {
      ++histo[TransformColorRed((uint8_t)green_to_red, argb[x])];
    }
    argb += stride;
  }
}